

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O3

sexp sexp_bignum_fxmul(sexp ctx,sexp d,sexp a,sexp_uint_t b,int offset)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  sexp_conflict *ppsVar4;
  ulong uVar5;
  sexp psVar6;
  sexp psVar7;
  long lVar8;
  sexp tmp;
  sexp local_48;
  sexp_gc_var_t local_40;
  
  local_40.var = &local_48;
  psVar7 = (a->value).type.cpl;
  local_48 = (sexp)0x43e;
  local_40.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_40;
  lVar8 = (long)offset;
  if ((d == (sexp)0x0) ||
     (ppsVar4 = &local_48, (d->value).type.cpl < (sexp)((long)&psVar7->tag + lVar8))) {
    d = sexp_make_bignum(ctx,(long)&psVar7->tag + lVar8);
    ppsVar4 = local_40.var;
  }
  local_40.var = ppsVar4;
  if (psVar7 != (sexp)0x0) {
    psVar6 = (sexp)0x0;
    uVar5 = 0;
    do {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar5;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = b;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = *(ulong *)((long)&a->value + (long)psVar6 * 8 + 0x10);
      auVar3 = auVar1 * auVar2 + auVar3;
      uVar5 = auVar3._8_8_;
      *(long *)((long)&d->value + (long)psVar6 * 8 + lVar8 * 8 + 0x10) = auVar3._0_8_;
      psVar6 = (sexp)((long)&psVar6->tag + 1);
    } while (psVar7 != psVar6);
    if (uVar5 != 0) {
      psVar7 = (sexp)((long)&psVar7->tag + lVar8);
      if ((d->value).type.cpl <= psVar7) {
        local_48 = d;
        d = sexp_copy_bignum(ctx,(sexp)0x0,d,(sexp_uint_t)((long)&psVar7->tag + 1));
      }
      *(ulong *)((long)&d->value + (long)psVar7 * 8 + 0x10) = uVar5;
    }
  }
  (ctx->value).context.saves = local_40.next;
  return d;
}

Assistant:

sexp sexp_bignum_fxmul (sexp ctx, sexp d, sexp a, sexp_uint_t b, int offset) {
  sexp_uint_t len=sexp_bignum_length(a), *data, *adata=sexp_bignum_data(a),
    carry=0, i;
  sexp_luint_t n;
  sexp_gc_var1(tmp);
  sexp_gc_preserve1(ctx, tmp);
  if ((! d) || (sexp_bignum_length(d) < len+offset))
    d = sexp_make_bignum(ctx, len+offset);
  tmp = d;
  data = sexp_bignum_data(d);
  for (i=0; i<len; i++) {
    n = luint_add(luint_mul_uint(luint_from_uint(adata[i]), b), luint_from_uint(carry));
    data[i+offset] = luint_to_uint(n);
    carry = luint_to_uint(luint_shr(n, (sizeof(sexp_uint_t)*8)));
  }
  if (carry) {
    if (sexp_bignum_length(d) <= len+offset)
      d = sexp_copy_bignum(ctx, NULL, d, len+offset+1);
    sexp_bignum_data(d)[len+offset] = carry;
  }
  sexp_gc_release1(ctx);
  return d;
}